

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh_arch.cc
# Opt level: O3

Translate * __thiscall
SleighArchitecture::buildTranslator(SleighArchitecture *this,DocumentStorage *store)

{
  Sleigh *this_00;
  
  if (last_sleigh != (Sleigh *)0x0) {
    if (last_languageindex == *(int *)&(this->super_Architecture).field_0x3a4) {
      Sleigh::reset(last_sleigh,(this->super_Architecture).loader,(this->super_Architecture).context
                   );
      return (Translate *)last_sleigh;
    }
    (*(last_sleigh->super_SleighBase).super_Translate.super_AddrSpaceManager._vptr_AddrSpaceManager
      [1])();
    last_sleigh = (Sleigh *)0x0;
  }
  this_00 = (Sleigh *)operator_new(0x260);
  Sleigh::Sleigh(this_00,(this->super_Architecture).loader,(this->super_Architecture).context);
  last_languageindex = *(int4 *)&(this->super_Architecture).field_0x3a4;
  last_sleigh = this_00;
  return (Translate *)this_00;
}

Assistant:

Translate *SleighArchitecture::buildTranslator(DocumentStorage &store)

{				// Build a sleigh translator
  if (isTranslateReused()) {
    last_sleigh->reset(loader,context);
    return last_sleigh;
  }
  else {
    last_sleigh = new Sleigh(loader,context);
    last_languageindex = languageindex;
    return last_sleigh;
  }
}